

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_timer_clear_all(void)

{
  fio_ls_embd_s *pfVar1;
  fio_ls_embd_s *pfVar2;
  fio_ls_embd_s *__ptr;
  fio_lock_i ret;
  timespec local_28;
  
  LOCK();
  UNLOCK();
  local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fio_timer_lock);
  if (fio_timer_lock != '\0') {
    do {
      fio_timer_lock = '\x01';
      local_28.tv_sec = 0;
      local_28.tv_nsec = 1;
      nanosleep(&local_28,(timespec *)0x0);
      LOCK();
      UNLOCK();
      local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fio_timer_lock);
    } while (fio_timer_lock != '\0');
  }
  fio_timer_lock = '\x01';
  while (__ptr = fio_timers.prev, fio_timers.next != &fio_timers) {
    pfVar1 = (fio_timers.prev)->next;
    if (pfVar1 == fio_timers.prev || pfVar1 == (fio_ls_embd_s *)0x0) {
      __ptr = (fio_ls_embd_s *)0x0;
    }
    else {
      pfVar2 = (fio_timers.prev)->prev;
      pfVar1->prev = pfVar2;
      pfVar2->next = pfVar1;
      __ptr->next = __ptr;
      __ptr->prev = __ptr;
    }
    if (__ptr[4].prev != (fio_ls_embd_s *)0x0) {
      (*(code *)__ptr[4].prev)(__ptr[3].next);
    }
    free(__ptr);
  }
  LOCK();
  fio_timer_lock = '\0';
  UNLOCK();
  return;
}

Assistant:

static void fio_timer_clear_all(void) {
  fio_lock(&fio_timer_lock);
  while (fio_ls_embd_any(&fio_timers)) {
    fio_timer_s *timer =
        FIO_LS_EMBD_OBJ(fio_timer_s, node, fio_ls_embd_pop(&fio_timers));
    if (timer->on_finish)
      timer->on_finish(timer->arg);
    free(timer);
  }
  fio_unlock(&fio_timer_lock);
}